

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp9d_vdpu382.c
# Opt level: O3

MPP_RET hal_vp9d_vdpu382_control(void *hal,MpiCmd cmd_type,void *param)

{
  MppFrameFormat MVar1;
  HalVp9dCtx *p_hal;
  
  if (cmd_type == MPP_DEC_SET_FRAME_INFO) {
    MVar1 = mpp_frame_get_fmt(param);
    if ((MVar1 & 0xf00000) == MPP_FMT_YUV420SP) {
      mpp_slots_set_prop(*(MppBufSlots *)((long)hal + 0x18),SLOTS_HOR_ALIGN,vp9_hor_align);
    }
    else {
      vdpu382_afbc_align_calc(*(MppBufSlots *)((long)hal + 0x18),param,0);
    }
  }
  return MPP_OK;
}

Assistant:

static MPP_RET hal_vp9d_vdpu382_control(void *hal, MpiCmd cmd_type, void *param)
{
    HalVp9dCtx *p_hal = (HalVp9dCtx*)hal;

    switch ((MpiCmd)cmd_type) {
    case MPP_DEC_SET_FRAME_INFO : {
        MppFrameFormat fmt = mpp_frame_get_fmt((MppFrame)param);

        if (MPP_FRAME_FMT_IS_FBC(fmt)) {
            vdpu382_afbc_align_calc(p_hal->slots, (MppFrame)param, 0);
        } else {
            mpp_slots_set_prop(p_hal->slots, SLOTS_HOR_ALIGN, vp9_hor_align);
        }
    } break;
    default : {
    } break;
    }

    return MPP_OK;
}